

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

int __thiscall zmq::context_t::shutdown(context_t *this,int __fd,int __how)

{
  int in_EAX;
  int iVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  if (this->ptr != (void *)0x0) {
    iVar1 = zmq_ctx_shutdown(this->ptr,CONCAT44(in_register_00000034,__fd),
                             CONCAT44(in_register_00000014,__how));
    if (iVar1 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",
                    0x379,"void zmq::context_t::shutdown()");
    }
  }
  return in_EAX;
}

Assistant:

void shutdown() ZMQ_NOTHROW
    {
        if (ptr == ZMQ_NULLPTR)
            return;
        int rc = zmq_ctx_shutdown(ptr);
        ZMQ_ASSERT(rc == 0);
    }